

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMeshControl::CreateInterfaceElements(TPZMHMeshControl *this)

{
  int iVar1;
  int iVar2;
  TPZGeoEl **ppTVar3;
  long lVar4;
  _Base_ptr p_Var5;
  TPZGeoEl *pTVar6;
  TPZInterfaceElement *this_00;
  bool bVar7;
  bool bVar8;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  TPZGeoElSide smallGeoElSide;
  _Self __tmp;
  TPZCompElSide csmall;
  TPZCompElSide celskeleton;
  TPZStack<TPZGeoElSide,_10> gelstack;
  TPZGeoElSide local_230;
  undefined **local_218;
  int local_210;
  int local_20c;
  undefined **local_208;
  TPZGeoEl *local_200;
  int local_1f8;
  undefined **local_1f0;
  TPZGeoEl *local_1e8;
  int local_1e0;
  TPZGeoElSide local_1d8;
  _func_int **local_1c0;
  TPZGeoElSide local_1b8;
  TPZGeoEl *local_1a0;
  int local_198;
  _func_int **local_190;
  _Base_ptr local_188;
  _Base_ptr local_180;
  TPZGeoEl *local_178;
  _Base_ptr local_170;
  _Base_ptr local_168;
  TPZCompElSide local_160;
  TPZCompElSide local_150;
  undefined1 local_140 [272];
  
  TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
  local_180 = (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_188 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_180 != local_188) {
    local_218 = &PTR__TPZManVector_01842518;
    local_190 = (_func_int **)&PTR__TPZManVector_018421d8;
    local_1c0 = (_func_int **)&PTR__TPZVec_0183b870;
    do {
      local_168 = local_180[1]._M_parent;
      local_170 = local_180[1]._M_left;
      local_210 = this->fLagrangeMatIdLeft;
      local_20c = this->fLagrangeMatIdRight;
      if (local_170 == *(_Base_ptr *)(local_180 + 1) || (long)local_168 < (long)local_170) {
        local_210 = this->fLagrangeMatIdRight;
        local_20c = this->fLagrangeMatIdLeft;
      }
      ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,
                           (int64_t)*(_Base_ptr *)(local_180 + 1));
      pTVar6 = *ppTVar3;
      local_1d8.fSide = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
      local_1d8.fSide = local_1d8.fSide + -1;
      local_1d8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
      local_1d8.fGeoEl = pTVar6;
      local_178 = pTVar6;
      TPZGeoElSide::Reference(&local_1d8);
      if (local_150.fEl == (TPZCompEl *)0x0) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x311);
      }
      if (local_1d8.fGeoEl == (TPZGeoEl *)0x0) {
        local_1f0 = &PTR__TPZGeoElSide_01920090;
        local_1e8 = (TPZGeoEl *)0x0;
        local_1e0 = -1;
      }
      else {
        (**(code **)(*(long *)local_1d8.fGeoEl + 0x188))
                  (&local_1f0,local_1d8.fGeoEl,local_1d8.fSide);
      }
      do {
        if (((local_1e8 == local_1d8.fGeoEl) && (local_1e0 == local_1d8.fSide)) ||
           (iVar1 = local_1e8->fMatId, bVar7 = iVar1 != this->fSkeletonWrapMatId,
           bVar8 = iVar1 != this->fBoundaryWrapMatId, !bVar8 || !bVar7)) break;
        if (local_1e8 == (TPZGeoEl *)0x0) {
          local_140._0_8_ = &PTR__TPZGeoElSide_01920090;
          local_140._8_8_ = (TPZGeoEl *)0x0;
          local_140._16_4_ = 0xffffffff;
        }
        else {
          (**(code **)(*(long *)local_1e8 + 0x188))(local_140);
        }
        local_1e0 = local_140._16_4_;
        local_1e8 = (TPZGeoEl *)local_140._8_8_;
      } while (bVar8 && bVar7);
      if ((local_1e8 == local_1d8.fGeoEl) && (local_1e0 == local_1d8.fSide)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0x31d);
      }
      lVar4 = 0x30;
      do {
        *(undefined ***)(local_140 + lVar4 + -0x10) = &PTR__TPZGeoElSide_01920090;
        *(undefined8 *)(local_140 + lVar4 + -8) = 0;
        *(undefined4 *)(local_140 + lVar4) = 0xffffffff;
        lVar4 = lVar4 + 0x18;
      } while (lVar4 != 0x120);
      local_140._8_8_ = local_140 + 0x20;
      local_140._16_8_ = 0;
      local_140._24_8_ = 0;
      local_140._0_8_ = local_190;
      local_1a0 = local_1e8;
      local_198 = local_1e0;
      TPZManVector<TPZGeoElSide,_10>::Resize((TPZManVector<TPZGeoElSide,_10> *)local_140,1);
      *(int *)(local_140._8_8_ + local_140._16_8_ * 0x18 + -8) = local_198;
      *(TPZGeoEl **)(local_140._8_8_ + local_140._16_8_ * 0x18 + -0x10) = local_1a0;
      while (local_140._16_8_ != 0) {
        TPZStack<TPZGeoElSide,_10>::Pop(&local_1b8,(TPZStack<TPZGeoElSide,_10> *)local_140);
        iVar1 = TPZGeoElSide::Dimension(&local_1b8);
        iVar2 = (**(code **)(*(long *)local_178 + 0x210))();
        if (iVar1 == iVar2) {
          if (local_1b8.fGeoEl == (TPZGeoEl *)0x0) {
            local_230.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
            local_230.fGeoEl = (TPZGeoEl *)0x0;
            local_230.fSide = -1;
          }
          else {
            (**(code **)(*(long *)local_1b8.fGeoEl + 0x188))
                      (&local_230,local_1b8.fGeoEl,local_1b8.fSide);
          }
          while ((local_230.fGeoEl != local_1b8.fGeoEl || (local_230.fSide != local_1b8.fSide))) {
            iVar1 = (**(code **)(*(long *)local_230.fGeoEl + 0x210))();
            if (iVar1 == ((this->fGMesh).fRef)->fPointer->fDim) {
              TPZGeoElSide::Reference(&local_230);
              if (local_160.fEl != (TPZCompEl *)0x0) {
                p_Var5 = (_Base_ptr)WhichSubdomain(this,local_160.fEl);
                iVar1 = local_20c;
                if (p_Var5 != local_168) {
                  p_Var5 = (_Base_ptr)WhichSubdomain(this,local_160.fEl);
                  iVar1 = -1;
                  if (p_Var5 == local_170) {
                    iVar1 = local_210;
                  }
                }
                if (iVar1 == -1) {
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                             ,0x33d);
                }
                pTVar6 = (TPZGeoEl *)
                         (**(code **)(*(long *)local_1b8.fGeoEl + 0x170))
                                   (local_1b8.fGeoEl,local_1b8.fSide,iVar1);
                this_00 = (TPZInterfaceElement *)operator_new(0x80);
                TPZInterfaceElement::TPZInterfaceElement
                          (this_00,((this->fCMesh).fRef)->fPointer,pTVar6,&local_160,&local_150);
              }
              if (local_230.fGeoEl == (TPZGeoEl *)0x0) {
LAB_013ba70d:
                local_208 = &PTR__TPZGeoElSide_01920090;
                local_200 = (TPZGeoEl *)0x0;
                local_1f8 = -1;
              }
              else {
                (**(code **)(*(long *)local_230.fGeoEl + 0x188))
                          (&local_208,local_230.fGeoEl,local_230.fSide);
              }
            }
            else {
              if (local_230.fGeoEl == (TPZGeoEl *)0x0) goto LAB_013ba70d;
              (**(code **)(*(long *)local_230.fGeoEl + 0x188))
                        (&local_208,local_230.fGeoEl,local_230.fSide);
            }
            local_230.fGeoEl = local_200;
            local_230.fSide = local_1f8;
          }
          TPZGeoElSide::GetSubElements2(&local_1b8,(TPZStack<TPZGeoElSide,_10> *)local_140);
        }
      }
      if ((TPZGeoEl *)local_140._8_8_ == (TPZGeoEl *)(local_140 + 0x20)) {
        local_140._8_8_ = (TPZGeoEl *)0x0;
      }
      local_140._24_8_ = 0;
      local_140._0_8_ = local_1c0;
      if ((TPZGeoEl *)local_140._8_8_ != (TPZGeoEl *)0x0) {
        operator_delete__(&((TPZGeoEl *)(local_140._8_8_ + -0x40))->fNumInterfaces,
                          *(long *)&((TPZGeoEl *)(local_140._8_8_ + -0x40))->fNumInterfaces * 0x18 +
                          8);
      }
      local_180 = (_Base_ptr)std::_Rb_tree_increment(local_180);
    } while (local_180 != local_188);
  }
  return;
}

Assistant:

void TPZMHMeshControl::CreateInterfaceElements()
{
    fCMesh->LoadReferences();
    int dim = fGMesh->Dimension();
    std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
    /// loop over the skeleton elements
    for (it=fInterfaces.begin(); it != fInterfaces.end(); it++) {
        // index of the skeleton element
        int64_t elindex = it->first;
        // left and right indexes in the coarse mesh
        int64_t leftelindex = it->second.first;
        int64_t rightelindex = it->second.second;
        // skip boundary elements
        int matid = 0, matidleft = 0, matidright = 0;

        // second condition indicates a boundary element
        if (leftelindex < rightelindex || rightelindex == elindex)
        {
            matidleft = fLagrangeMatIdLeft;
            matidright = fLagrangeMatIdRight;
        }
        else
        {
            matidleft = fLagrangeMatIdRight;
            matidright = fLagrangeMatIdLeft;
        }
        int numlado = 2;
        if (rightelindex == elindex) {
            numlado = 1;
        }

        TPZGeoEl *gel = fGMesh->ElementVec()[elindex];
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        TPZCompElSide celskeleton = gelside.Reference();
        // the skeleton element must exist
        if(!celskeleton.Element()) DebugStop();
        TPZGeoElSide neighbour = gelside.Neighbour();
        while(neighbour != gelside)
        {
            int neighmatid = neighbour.Element()->MaterialId();
            if(neighmatid == fSkeletonWrapMatId || neighmatid == fBoundaryWrapMatId)
            {
                break;
            }
            neighbour = neighbour.Neighbour();
        }
        if (neighbour == gelside) {
            DebugStop();
        }
        TPZStack<TPZGeoElSide> gelstack;
        gelstack.Push(neighbour);
        while (gelstack.size())
        {
            TPZGeoElSide smallGeoElSide = gelstack.Pop();
            // the smaller elements returned by GetSubElements include element/sides of lower dimension
            if (smallGeoElSide.Dimension() != gel->Dimension()) {
                continue;
            }
            // look for the neighbours of smallGeoElSide for elements which are of dimension of the fGMesh
            // and which beint64_t to the subdomains
            TPZGeoElSide neighbour = smallGeoElSide.Neighbour();
            while (neighbour != smallGeoElSide)
            {
                if (neighbour.Element()->Dimension() != fGMesh->Dimension()) {
                    neighbour = neighbour.Neighbour();
                    continue;
                }
                TPZCompElSide csmall = neighbour.Reference();
                if (csmall)
                {
                    int matid = -1;
                    if(WhichSubdomain(csmall.Element()) == leftelindex) {
                        matid = matidleft;
                    }
                    else if(WhichSubdomain(csmall.Element()) == rightelindex)
                    {
                        matid = matidright;
                    }
                    if (matid == -1) {
                        DebugStop();
                    }
                    // create an interface between the finer element and the MHM flux
                    TPZGeoEl *gelnew = smallGeoElSide.Element()->CreateBCGeoEl(smallGeoElSide.Side(), matid);
                    new TPZInterfaceElement(fCMesh, gelnew, csmall, celskeleton);
#ifdef PZ_LOG
                    if (logger.isDebugEnabled()) {
                        std::stringstream sout;
                        sout << "New interface left " << smallGeoElSide.Element()->Index() << " right " << gel->Index() << " matid " << matid;
                        sout << " interface index " << gelnew->Reference()->Index() << " beint64_ts to subdomain " << WhichSubdomain(gelnew->Reference());
                        LOGPZ_DEBUG(logger, sout.str())
                    }
#endif
                }
                neighbour = neighbour.Neighbour();
            }

            smallGeoElSide.GetSubElements2(gelstack);
        }
    }
}